

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<Fad<double>_> *pA)

{
  long lVar1;
  int64_t iVar2;
  long local_c8;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_98;
  Fad<double> local_88;
  Fad<double> local_68;
  Fad<double> local_48;
  
  lVar1 = rowSize + pRow;
  if (((pA->super_TPZBaseMatrix).fRow < lVar1) || ((pA->super_TPZBaseMatrix).fCol < colSize + pCol))
  {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  local_c8 = sRow;
  while( true ) {
    iVar2 = pCol;
    if (lVar1 <= pRow) break;
    for (; iVar2 < colSize + pCol; iVar2 = iVar2 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_88,this,local_c8);
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_68,pA,pRow,iVar2);
      local_98.fadexpr_.left_ = &local_88;
      local_98.fadexpr_.right_ = &local_68;
      Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(&local_48,&local_98);
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(pA,pRow,iVar2,&local_48);
      Fad<double>::~Fad(&local_48);
      Fad<double>::~Fad(&local_68);
      Fad<double>::~Fad(&local_88);
    }
    pRow = pRow + 1;
    local_c8 = local_c8 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}